

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O1

void work_gga_vxc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double __x;
  double dVar34;
  double dVar35;
  double dVar36;
  double __x_00;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double __x_01;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double __x_02;
  double dVar63;
  undefined1 auVar64 [16];
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  undefined1 auVar124 [16];
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double local_618;
  double local_5f0;
  double local_2f8;
  
  if (np != 0) {
    sVar17 = 0;
    do {
      if (p->nspin == 2) {
        lVar16 = (long)(p->dim).rho * sVar17;
        dVar49 = rho[lVar16] + rho[lVar16 + 1];
      }
      else {
        dVar49 = rho[(long)(p->dim).rho * sVar17];
      }
      dVar46 = p->dens_threshold;
      if (dVar46 <= dVar49) {
        dVar49 = rho[(long)(p->dim).rho * sVar17];
        if (rho[(long)(p->dim).rho * sVar17] <= dVar46) {
          dVar49 = dVar46;
        }
        dVar65 = p->sigma_threshold * p->sigma_threshold;
        dVar1 = sigma[(long)(p->dim).sigma * sVar17];
        pdVar9 = (double *)p->params;
        dVar74 = p->zeta_threshold;
        bVar10 = dVar74 < 1.0;
        bVar11 = dVar46 < dVar49 * 0.5;
        dVar19 = cbrt(0.3183098861837907);
        dVar20 = dVar19 * 1.4422495703074083;
        dVar21 = dVar20 * 2.519842099789747;
        dVar22 = cbrt(dVar74);
        dVar50 = dVar74 * dVar22;
        dVar46 = dVar50;
        if (dVar74 < 2.0) {
          dVar46 = 2.5198420997897464;
        }
        if (dVar1 <= dVar65) {
          dVar1 = dVar65;
        }
        dVar23 = cbrt(dVar49);
        dVar24 = cbrt(9.0);
        dVar66 = 1.0 / dVar23;
        dVar65 = (double)(~-(ulong)(2.0 <= dVar74) & 0x3ff0000000000000 |
                         (ulong)(1.2599210498948732 / dVar22) & -(ulong)(2.0 <= dVar74));
        dVar77 = dVar24 * dVar24 * dVar19 * dVar19 * p->cam_omega * 1.4422495703074083;
        dVar67 = (dVar66 * dVar77 * dVar65) / 18.0;
        dVar24 = 1.35;
        if (dVar67 <= 1.35) {
          dVar24 = dVar67;
        }
        dVar25 = erf((1.0 / dVar24) * 0.5);
        dVar51 = dVar24 * dVar24;
        dVar26 = exp((1.0 / dVar51) * -0.25);
        dVar120 = dVar67;
        if (dVar67 <= 1.35) {
          dVar120 = 1.35;
        }
        dVar102 = dVar120 * dVar120;
        dVar100 = dVar102 * dVar102;
        dVar78 = dVar100 * dVar100;
        auVar93._0_8_ = dVar78 * dVar78;
        auVar93._8_8_ = dVar78;
        auVar93 = divpd(_DAT_0103b460,auVar93);
        dVar95 = dVar51 * -2.0 * (dVar26 + -1.0) + dVar26 + -1.5;
        dVar25 = (dVar24 + dVar24) * dVar95 + dVar25 * 1.7724538509055159;
        dVar78 = auVar93._8_8_;
        if (dVar67 < 1.35) {
          dVar109 = dVar24 * -2.6666666666666665 * dVar25 + 1.0;
        }
        else {
          auVar47._0_8_ = dVar78 / (dVar102 * dVar100);
          auVar75._0_8_ = 1.0 / (dVar102 * dVar100);
          auVar85._8_8_ = dVar100;
          auVar85._0_8_ = dVar102;
          auVar113 = divpd(_DAT_0103b460,auVar85);
          auVar114 = divpd(auVar113,_DAT_01049d80);
          auVar75._8_8_ = dVar78;
          auVar75 = divpd(auVar75,_DAT_01049d90);
          auVar113._8_8_ = dVar78;
          auVar113._0_8_ = dVar78;
          auVar85 = divpd(auVar113,auVar85);
          auVar85 = divpd(auVar85,_DAT_01049da0);
          auVar47._8_8_ = auVar93._0_8_;
          auVar47 = divpd(auVar47,_DAT_01049db0);
          dVar109 = ((((((auVar114._0_8_ - auVar114._8_8_) + auVar75._0_8_) - auVar75._8_8_) +
                      auVar85._0_8_) - auVar85._8_8_) + auVar47._0_8_) - auVar47._8_8_;
        }
        dVar2 = pdVar9[1];
        dVar79 = dVar1 * dVar2;
        dVar125 = dVar49 * dVar49;
        dVar103 = 1.0 / (dVar23 * dVar23);
        dVar27 = dVar103 / dVar125;
        dVar115 = dVar27 * 1.5874010519681996;
        dVar52 = dVar1 * 1.5874010519681996 * dVar27;
        dVar121 = dVar52 * 0.004 + 1.0;
        dVar130 = dVar125 * dVar125;
        dVar28 = dVar121 * dVar121;
        dVar96 = dVar130 * dVar130;
        dVar132 = 1.0 / (dVar121 * dVar28);
        dVar131 = 1.0 / (dVar28 * dVar28);
        dVar126 = 1.0 / dVar121;
        dVar122 = dVar1 * dVar1;
        dVar3 = pdVar9[2];
        dVar53 = dVar122 * dVar3;
        dVar29 = (dVar66 / (dVar49 * dVar130)) * 1.2599210498948732;
        dVar128 = dVar29 * (1.0 / dVar28);
        dVar68 = dVar1 * dVar122;
        dVar4 = pdVar9[3];
        dVar88 = dVar68 * dVar4;
        dVar30 = 1.0 / dVar96;
        dVar116 = dVar30 * dVar132;
        dVar117 = dVar122 * dVar122;
        dVar5 = pdVar9[4];
        dVar89 = dVar117 * dVar5;
        dVar104 = (dVar103 / (dVar125 * dVar96)) * 1.5874010519681996;
        dVar105 = dVar104 * dVar131;
        dVar90 = dVar89 * 1.024e-09 * dVar105 +
                 dVar88 * 2.56e-07 * dVar116 +
                 dVar53 * 3.2e-05 * dVar128 + dVar79 * 0.004 * dVar115 * dVar126 + *pdVar9;
        dVar31 = dVar21 * 1.2599210498948732 * -0.046875 * dVar23 * dVar46;
        dVar80 = dVar109 * dVar90;
        dVar32 = 0.0;
        if (bVar11 && bVar10) {
          dVar32 = dVar31 * dVar80;
          dVar32 = dVar32 + dVar32;
        }
        local_5f0 = 1.0;
        if (1.0 <= dVar74) {
          local_5f0 = p->zeta_threshold;
        }
        uVar18 = -(ulong)(1.0 <= dVar74);
        dVar74 = (double)((ulong)(1.0 / dVar22) & uVar18 | ~uVar18 & 0x3ff0000000000000);
        dVar69 = dVar21 * dVar66;
        dVar70 = dVar69 * 1.2599210498948732 * dVar74;
        dVar81 = SQRT(dVar70);
        dVar22 = dVar81;
        if (dVar70 < 0.0) {
          dVar22 = sqrt(dVar70);
          dVar81 = sqrt(dVar70);
        }
        dVar33 = dVar70 * 0.053425 + 1.0;
        dVar81 = dVar81 * dVar70;
        dVar54 = dVar19 * dVar19 * 2.080083823051904 * 1.5874010519681996;
        dVar55 = dVar54 * dVar103;
        dVar56 = dVar55 * 1.5874010519681996 * dVar74 * dVar74;
        dVar57 = dVar56 * 0.123235 + dVar81 * 0.204775 + dVar22 * 3.79785 + dVar70 * 0.8969;
        __x = 16.081824322151103 / dVar57 + 1.0;
        dVar34 = log(__x);
        local_2f8 = 0.0;
        dVar35 = ((double)(-(ulong)(0.0 <= p->zeta_threshold) & (ulong)dVar50) + dVar46 + -2.0) *
                 1.9236610509315362;
        dVar36 = dVar70 * 0.05137 + 1.0;
        dVar58 = dVar56 * 0.1562925 + dVar81 * 0.420775 + dVar22 * 7.05945 + dVar70 * 1.549425;
        __x_00 = 32.1646831778707 / dVar58 + 1.0;
        dVar37 = log(__x_00);
        dVar38 = dVar70 * 0.0278125 + 1.0;
        dVar59 = dVar56 * 0.1241775 + dVar81 * 0.1100325 + dVar22 * 5.1785 + dVar70 * 0.905775;
        dVar81 = 29.608574643216677 / dVar59 + 1.0;
        dVar56 = log(dVar81);
        if (bVar11 && bVar10) {
          dVar60 = dVar33 * 0.062182 * dVar34;
          local_2f8 = (dVar35 * 0.019751789702565206 * dVar38 * dVar56 +
                      ((dVar38 * dVar56 * -0.019751789702565206 +
                       dVar36 * -0.03109 * dVar37 + dVar60) * dVar35 - dVar60)) * local_5f0 * 0.5;
        }
        dVar60 = pdVar9[6];
        dVar6 = pdVar9[7];
        dVar101 = dVar1 * dVar60;
        dVar110 = dVar52 * 0.2 + 1.0;
        dVar106 = 1.0 / dVar110;
        dVar97 = dVar122 * dVar6;
        dVar7 = pdVar9[8];
        dVar82 = dVar68 * dVar7;
        dVar8 = pdVar9[9];
        dVar91 = dVar117 * dVar8;
        dVar41 = pdVar9[5];
        dVar118 = SQRT(dVar69);
        local_618 = dVar118;
        if (dVar69 < 0.0) {
          local_618 = sqrt(dVar69);
        }
        dVar39 = dVar110 * dVar110;
        dVar83 = dVar29 * (1.0 / dVar39);
        dVar111 = 1.0 / (dVar110 * dVar39);
        dVar92 = 1.0 / (dVar39 * dVar39);
        dVar40 = dVar30 * dVar111;
        dVar61 = dVar104 * dVar92;
        dVar98 = dVar91 * 0.0064 * dVar61 +
                 dVar82 * 0.032 * dVar40 +
                 dVar97 * 0.08 * dVar83 + dVar101 * 0.2 * dVar115 * dVar106 + dVar41;
        dVar41 = local_2f8 + local_2f8;
        dVar107 = dVar69 * 0.053425 + 1.0;
        if (dVar69 < 0.0) {
          dVar118 = sqrt(dVar69);
        }
        dVar62 = dVar55 * 0.123235 +
                 dVar118 * dVar69 * 0.204775 + local_618 * 3.79785 + dVar69 * 0.8969;
        __x_01 = 16.081824322151103 / dVar62 + 1.0;
        dVar42 = log(__x_01);
        dVar50 = (double)(~uVar18 & 0x3ff0000000000000 | uVar18 & (ulong)dVar50);
        dVar71 = (dVar50 + dVar50 + -2.0) * 1.9236610509315362;
        dVar84 = dVar69 * 0.0278125 + 1.0;
        dVar72 = dVar55 * 0.1241775 +
                 dVar118 * dVar69 * 0.1100325 + local_618 * 5.1785 + dVar69 * 0.905775;
        __x_02 = 29.608574643216677 / dVar72 + 1.0;
        dVar43 = log(__x_02);
        dVar50 = pdVar9[0xb];
        dVar55 = pdVar9[0xc];
        dVar119 = dVar1 * dVar50;
        dVar63 = dVar52 * 0.006 + 1.0;
        dVar127 = 1.0 / dVar63;
        dVar108 = dVar122 * dVar55;
        dVar44 = dVar63 * dVar63;
        dVar29 = dVar29 * (1.0 / dVar44);
        dVar52 = pdVar9[0xd];
        dVar112 = dVar68 * dVar52;
        dVar123 = 1.0 / (dVar63 * dVar44);
        dVar30 = dVar30 * dVar123;
        dVar118 = pdVar9[0xe];
        dVar129 = 1.0 / (dVar44 * dVar44);
        dVar73 = dVar117 * dVar118;
        dVar104 = dVar104 * dVar129;
        dVar115 = dVar73 * 5.184e-09 * dVar104 +
                  dVar112 * 8.64e-07 * dVar30 +
                  dVar108 * 7.2e-05 * dVar29 + dVar115 * dVar119 * 0.006 * dVar127 + pdVar9[10];
        dVar99 = (dVar107 * -0.062182 * dVar42 + dVar71 * 0.019751789702565206 * dVar84 * dVar43) -
                 dVar41;
        dVar32 = dVar32 + dVar41 * dVar98 + dVar99 * dVar115;
        pdVar9 = out->zk;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar16 = (long)(p->dim).zk * sVar17;
          pdVar9[lVar16] = pdVar9[lVar16] + dVar32;
        }
        dVar45 = dVar66 / dVar49;
        dVar65 = (dVar77 * dVar45 * dVar65) / -54.0;
        if (dVar67 < 1.35) {
          dVar65 = (double)(~-(ulong)(1.35 < dVar67) & (ulong)dVar65);
          dVar65 = dVar65 * -2.6666666666666665 * dVar25 +
                   dVar24 * -2.6666666666666665 *
                   ((dVar24 + dVar24) *
                    (((dVar26 + -1.0) * dVar24 * -4.0 * dVar65 +
                     (1.0 / (dVar51 * dVar24)) * dVar65 * dVar26 * 0.5) -
                    (1.0 / dVar24) * dVar65 * dVar26) +
                   ((dVar65 + dVar65) * dVar95 - (1.0 / dVar51) * dVar26 * dVar65));
        }
        else {
          auVar64._0_8_ = dVar100 * dVar120;
          auVar64._8_8_ = dVar102 * dVar120;
          auVar47 = divpd(_DAT_0103b460,auVar64);
          auVar15._8_8_ = dVar78;
          auVar15._0_8_ = dVar78;
          auVar75 = divpd(auVar15,auVar64);
          dVar65 = (double)(-(ulong)(1.35 < dVar67) & (ulong)dVar65);
          auVar48._0_8_ = auVar47._0_8_ * dVar65;
          auVar48._8_8_ = auVar47._8_8_ * dVar65;
          auVar47 = divpd(auVar48,_DAT_01051f00);
          auVar86._8_8_ = 0x3ff0000000000000;
          auVar86._0_8_ = dVar78;
          auVar114._8_8_ = auVar64._8_8_ * dVar100;
          auVar114._0_8_ = dVar120;
          auVar85 = divpd(auVar86,auVar114);
          auVar87._0_8_ = auVar85._0_8_ * dVar65;
          auVar87._8_8_ = auVar85._8_8_ * dVar65;
          auVar85 = divpd(auVar87,_DAT_01049dd0);
          auVar124._0_8_ = auVar75._0_8_ * dVar65;
          auVar124._8_8_ = auVar75._8_8_ * dVar65;
          auVar75 = divpd(auVar124,_DAT_01049de0);
          auVar13._8_8_ = auVar64._8_8_ * dVar100;
          auVar13._0_8_ = dVar120;
          auVar93 = divpd(auVar93,auVar13);
          auVar94._0_8_ = auVar93._0_8_ * dVar65;
          auVar94._8_8_ = auVar93._8_8_ * dVar65;
          auVar93 = divpd(auVar94,_DAT_01049df0);
          dVar65 = ((((((auVar47._0_8_ - auVar47._8_8_) - auVar85._8_8_) + auVar85._0_8_) -
                     auVar75._8_8_) + auVar75._0_8_) - auVar93._8_8_) + auVar93._0_8_;
        }
        dVar26 = (dVar103 / (dVar49 * dVar125)) * 1.5874010519681996;
        dVar77 = (dVar66 / (dVar130 * dVar125)) * 1.2599210498948732;
        dVar120 = 1.0 / (dVar49 * dVar96);
        dVar25 = dVar103 / (dVar49 * dVar125 * dVar96);
        dVar24 = dVar1 * dVar117;
        dVar66 = (1.2599210498948732 / dVar23) / (dVar130 * dVar125 * dVar96);
        dVar67 = 0.0;
        if (bVar11 && bVar10) {
          dVar51 = (1.0 / dVar28) * dVar77;
          dVar132 = dVar132 * dVar120;
          dVar67 = dVar131 * dVar25 * 1.5874010519681996;
          dVar67 = (dVar67 * dVar89 * -1.0922666666666667e-08 +
                    dVar117 * dVar4 * 8.192e-09 * dVar67 +
                    dVar132 * dVar88 * -2.048e-06 +
                    dVar68 * dVar3 * 1.3653333333333333e-06 * dVar132 +
                    dVar51 * dVar53 * -0.00017066666666666668 +
                    dVar79 * -0.010666666666666666 * dVar26 * dVar126 +
                    dVar122 * dVar2 * 8.533333333333334e-05 * dVar51 +
                   dVar66 * (dVar131 / dVar121) * dVar24 * dVar5 * 8.738133333333333e-11) * dVar109
                   * dVar31 +
                   dVar90 * dVar65 * dVar31 +
                   dVar46 * dVar103 * dVar21 * 1.2599210498948732 * dVar80 * -0.015625;
        }
        dVar46 = dVar45 * 2.519842099789747;
        if (dVar70 < 0.0) {
          dVar70 = sqrt(dVar70);
        }
        else {
          dVar70 = SQRT(dVar70);
        }
        dVar54 = dVar54 * (dVar103 / dVar49);
        dVar65 = 0.0;
        if (bVar11 && bVar10) {
          dVar28 = dVar74 * dVar74 * dVar54 * 1.5874010519681996;
          dVar65 = dVar46 * dVar74 * 1.2599210498948732;
          dVar78 = dVar19 * dVar70 * 1.4422495703074083 * dVar65;
          dVar65 = dVar19 * (1.0 / dVar22) * 1.4422495703074083 * dVar65;
          dVar22 = dVar45 * 1.2599210498948732;
          dVar95 = dVar74 * dVar22 * dVar21;
          dVar100 = dVar28 * -0.082785 +
                    dVar78 * -0.05501625 + dVar65 * -0.8630833333333333 + dVar95 * -0.301925;
          auVar76._8_8_ = dVar59 * dVar59;
          auVar76._0_8_ = dVar81;
          auVar93 = divpd(_DAT_0103b460,auVar76);
          auVar14._8_8_ = __x_00;
          auVar14._0_8_ = dVar58 * dVar58;
          auVar85 = divpd(_DAT_0103b460,auVar14);
          auVar12._8_8_ = __x;
          auVar12._0_8_ = dVar57 * dVar57;
          auVar47 = divpd(_DAT_0103b460,auVar12);
          dVar51 = (dVar28 * -0.08215666666666667 +
                   dVar78 * -0.1023875 + dVar65 * -0.632975 + dVar95 * -0.29896666666666666) *
                   auVar47._8_8_ * dVar33 * auVar47._0_8_;
          dVar102 = dVar34 * dVar74 * dVar21 * 0.0011073577833333333 * dVar22;
          dVar65 = local_5f0 *
                   (dVar38 * dVar35 * -0.5848223397455204 * auVar93._8_8_ * dVar100 * auVar93._0_8_
                   + dVar20 * dVar35 * -0.0001831155503675316 * dVar46 *
                     dVar74 * 1.2599210498948732 * dVar56 +
                     (auVar93._8_8_ * dVar38 * 0.5848223397455204 * auVar93._0_8_ * dVar100 +
                     dVar21 * 0.0001831155503675316 * dVar22 * dVar56 * dVar74 +
                     ((((dVar28 * -0.104195 +
                        dVar78 * -0.2103875 + dVar65 * -1.176575 + dVar95 * -0.516475) *
                        auVar85._8_8_ * dVar36 * auVar85._0_8_ +
                       dVar21 * 0.0005323644333333333 * dVar22 * dVar37 * dVar74) - dVar102) -
                     dVar51)) * dVar35 + dVar102 + dVar51) * 0.5;
        }
        dVar74 = dVar25 * dVar92 * 1.5874010519681996;
        dVar22 = dVar19 * 2.519842099789747 * dVar45;
        dVar21 = (1.0 / local_618) * 1.4422495703074083 * dVar22;
        if (dVar69 < 0.0) {
          dVar69 = sqrt(dVar69);
        }
        else {
          dVar69 = SQRT(dVar69);
        }
        dVar22 = dVar22 * dVar69 * 1.4422495703074083;
        dVar25 = dVar25 * dVar129 * 1.5874010519681996;
        pdVar9 = out->vrho;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          dVar51 = (1.0 / dVar39) * dVar77;
          dVar111 = dVar111 * dVar120;
          local_2f8 = local_2f8 *
                      (dVar91 * -0.06826666666666667 * dVar74 +
                       dVar117 * dVar7 * 0.0512 * dVar74 +
                       dVar82 * -0.256 * dVar111 +
                       dVar68 * dVar6 * 0.17066666666666666 * dVar111 +
                       dVar97 * -0.4266666666666667 * dVar51 +
                       dVar101 * -0.5333333333333333 * dVar26 * dVar106 +
                       dVar122 * dVar60 * 0.21333333333333335 * dVar51 +
                      dVar24 * dVar8 * 0.027306666666666667 * dVar66 * (dVar92 / dVar110));
          dVar98 = dVar98 * dVar65;
          dVar77 = (1.0 / dVar44) * dVar77;
          dVar123 = dVar123 * dVar120;
          lVar16 = (long)(p->dim).vrho * sVar17;
          pdVar9[lVar16] =
               (local_2f8 + local_2f8 + dVar67 + dVar67 + dVar98 + dVar98 +
                dVar115 * ((dVar45 * dVar19 * 2.519842099789747 *
                                     dVar71 * 1.4422495703074083 * -0.0001831155503675316 * dVar43 +
                            dVar20 * 0.0011073577833333333 * dVar46 * dVar42 +
                            (1.0 / __x_01) *
                            (dVar54 * -0.08215666666666667 +
                            dVar22 * -0.1023875 +
                            dVar21 * -0.632975 + dVar20 * dVar46 * -0.29896666666666666) *
                            dVar107 * (1.0 / (dVar62 * dVar62)) +
                           dVar84 * dVar71 * -0.5848223397455204 *
                           (1.0 / __x_02) *
                           (dVar54 * -0.082785 +
                           dVar22 * -0.05501625 +
                           dVar21 * -0.8630833333333333 + dVar20 * dVar46 * -0.301925) *
                           (1.0 / (dVar72 * dVar72))) - (dVar65 + dVar65)) +
               (dVar73 * -5.5296e-08 * dVar25 +
                dVar117 * dVar52 * 4.1472e-08 * dVar25 +
                dVar112 * -6.912e-06 * dVar123 +
                dVar68 * dVar55 * 4.608e-06 * dVar123 +
                dVar108 * -0.000384 * dVar77 +
                dVar119 * -0.016 * dVar26 * dVar127 + dVar122 * dVar50 * 0.000192 * dVar77 +
               dVar24 * dVar118 * 6.63552e-10 * dVar66 * (dVar129 / dVar63)) * dVar99) * dVar49 +
               dVar32 + pdVar9[lVar16];
        }
        dVar74 = (1.2599210498948732 / dVar23) / (dVar96 * dVar49 * dVar130);
        dVar46 = 0.0;
        if (bVar11 && bVar10) {
          dVar31 = dVar31 * dVar109 * (dVar5 * dVar68 * 4.096e-09 * dVar105 +
                                       dVar88 * -3.072e-09 * dVar105 +
                                       dVar4 * dVar122 * 7.68e-07 * dVar116 +
                                       dVar53 * -5.12e-07 * dVar116 +
                                       dVar3 * dVar1 * 6.4e-05 * dVar128 +
                                       dVar2 * 1.5874010519681996 * 0.004 * dVar27 * dVar126 +
                                       dVar79 * -3.2e-05 * dVar128 +
                                      (dVar131 / dVar121) * dVar74 * dVar89 * -3.2768e-11);
          dVar46 = dVar31 + dVar31;
        }
        pdVar9 = out->vsigma;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar16 = (long)(p->dim).vsigma * sVar17;
          pdVar9[lVar16] =
               dVar49 * (dVar99 * (dVar118 * dVar68 * 2.0736e-08 * dVar104 +
                                   dVar112 * -1.5552e-08 * dVar104 +
                                   dVar52 * dVar122 * 2.592e-06 * dVar30 +
                                   dVar108 * -1.728e-06 * dVar30 +
                                   dVar55 * dVar1 * 0.000144 * dVar29 +
                                   dVar50 * 1.5874010519681996 * 0.006 * dVar27 * dVar127 +
                                   dVar119 * -7.2e-05 * dVar29 +
                                  dVar73 * -2.48832e-10 * (dVar129 / dVar63) * dVar74) +
                        dVar41 * (dVar8 * dVar68 * 0.0256 * dVar61 +
                                  dVar82 * -0.0192 * dVar61 +
                                  dVar7 * dVar122 * 0.096 * dVar40 +
                                  dVar97 * -0.064 * dVar40 +
                                  dVar6 * dVar1 * 0.16 * dVar83 +
                                  dVar60 * 1.5874010519681996 * 0.2 * dVar27 * dVar106 +
                                  dVar101 * -0.08 * dVar83 +
                                 dVar91 * -0.01024 * (dVar92 / dVar110) * dVar74) + dVar46) +
               pdVar9[lVar16];
        }
      }
      sVar17 = sVar17 + 1;
    } while (np != sVar17);
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}